

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O1

UserData AllocUserData(void)

{
  UserData paVar1;
  sunrealtype **ppsVar2;
  sunindextype *psVar3;
  long lVar4;
  long lVar5;
  UserData paVar6;
  
  paVar1 = (UserData)malloc(0x998);
  lVar5 = 0;
  paVar6 = paVar1;
  do {
    lVar4 = 0;
    do {
      ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
      paVar6->P[0][lVar4] = ppsVar2;
      ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
      paVar6->Jbd[0][lVar4] = ppsVar2;
      psVar3 = (sunindextype *)SUNDlsMat_newIndexArray(2);
      paVar6->pivot[0][lVar4] = psVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    lVar5 = lVar5 + 1;
    paVar6 = (UserData)(paVar6->P + 1);
  } while (lVar5 != 10);
  return paVar1;
}

Assistant:

static UserData AllocUserData(void)
{
  int jx, jy;
  UserData data;

  data = (UserData)malloc(sizeof *data);

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      (data->P)[jx][jy]     = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);
      (data->Jbd)[jx][jy]   = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);
      (data->pivot)[jx][jy] = SUNDlsMat_newIndexArray(NUM_SPECIES);
    }
  }

  return (data);
}